

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_sse2.c
# Opt level: O0

void aom_highbd_quantize_b_sse2
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  long lVar4;
  long in_RCX;
  short *in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar5 [16];
  uint32_t abs_qcoeff;
  int64_t tmp4;
  int64_t tmp3;
  long in_stack_00000018;
  int k;
  int coeff_sign [4];
  int abs_coeff [4];
  int test_1;
  __m128i tmp2;
  __m128i tmp1;
  __m128i coeffs_sign;
  __m128i coeffs_1;
  int test;
  __m128i cmp2;
  __m128i cmp1;
  __m128i coeffs;
  __m128i nzbins [2];
  __m128i zbins [2];
  int eob_i;
  int non_zero_regs;
  int j;
  int i;
  int local_3a8;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  uint local_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  uint local_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int local_2d8 [4];
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  undefined8 local_2b8 [4];
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  long local_288;
  long local_280;
  long local_278;
  ulong local_268;
  long local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong *local_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 *local_8;
  
  local_268._0_4_ = (int)in_RSI;
  if ((int)local_268 < 0) {
    local_268._0_4_ = (int)local_268 + 3;
  }
  local_294 = (int)local_268 >> 2;
  local_298 = -1;
  local_238 = (int)in_RDX[1];
  local_23c = (int)*in_RDX;
  local_2b8[0] = CONCAT44(local_238,local_23c);
  local_2b8[1] = CONCAT44(local_238,local_238);
  local_22c = (int)in_RDX[1];
  local_2b8[2] = CONCAT44(local_22c,local_22c);
  local_2b8[3] = CONCAT44(local_22c,local_22c);
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_2d8[1] = -local_238;
  local_2d8[0] = -local_23c;
  local_2d8[3] = -local_238;
  local_2d8[2] = -local_238;
  local_1b8 = 0;
  uStack_1b0 = 0;
  _local_2c8 = CONCAT44(-local_22c,-local_22c);
  _iStack_2c0 = CONCAT44(-local_22c,-local_22c);
  local_288 = in_R9;
  local_280 = in_R8;
  local_278 = in_RCX;
  local_268 = in_RSI;
  local_260 = in_RDI;
  local_258 = local_2b8[0];
  uStack_250 = local_2b8[1];
  local_234 = local_238;
  local_230 = local_238;
  local_228 = local_2b8[2];
  uStack_220 = local_2b8[3];
  local_218 = local_22c;
  local_214 = local_22c;
  local_210 = local_22c;
  local_20c = local_22c;
  local_1c8 = local_2b8[2];
  uStack_1c0 = local_2b8[3];
  local_1a8 = local_2b8[0];
  uStack_1a0 = local_2b8[1];
  memset((void *)tmp4,0,in_RSI << 2);
  memset((void *)tmp3,0,local_268 << 2);
  for (local_28c = (int)((long)((ulong)(uint)((int)local_268 >> 0x1f) << 0x20 |
                               local_268 & 0xffffffff) / 4) + -1; -1 < local_28c;
      local_28c = local_28c + -1) {
    local_180 = (undefined8 *)(local_260 + (long)(local_28c << 2) * 4);
    local_2e8 = *local_180;
    uStack_2e0 = local_180[1];
    local_178 = local_2b8[(ulong)(local_28c != 0) * 2];
    uStack_170 = local_2b8[(ulong)(local_28c != 0) * 2 + 1];
    local_168 = local_2e8;
    uStack_160 = uStack_2e0;
    local_148 = local_178;
    uStack_140 = uStack_170;
    local_158 = local_2e8;
    uStack_150 = uStack_2e0;
    local_148._0_4_ = (int)local_178;
    local_148._4_4_ = (int)((ulong)local_178 >> 0x20);
    uStack_140._0_4_ = (int)uStack_170;
    uStack_140._4_4_ = (int)((ulong)uStack_170 >> 0x20);
    local_158._0_4_ = (int)local_2e8;
    local_158._4_4_ = (int)((ulong)local_2e8 >> 0x20);
    uStack_150._0_4_ = (int)uStack_2e0;
    uStack_150._4_4_ = (int)((ulong)uStack_2e0 >> 0x20);
    local_2f8 = CONCAT44(-(uint)(local_158._4_4_ < local_148._4_4_),
                         -(uint)((int)local_158 < (int)local_148));
    uStack_2f0 = CONCAT44(-(uint)(uStack_150._4_4_ < uStack_140._4_4_),
                          -(uint)((int)uStack_150 < (int)uStack_140));
    local_118 = *(undefined8 *)(local_2d8 + (ulong)(local_28c != 0) * 4);
    uStack_110 = *(undefined8 *)(local_2d8 + (ulong)(local_28c != 0) * 4 + 2);
    local_108 = local_2e8;
    uStack_100 = uStack_2e0;
    local_118._4_4_ = (int)((ulong)local_118 >> 0x20);
    uStack_110._4_4_ = (int)((ulong)uStack_110 >> 0x20);
    local_308 = -(uint)((int)local_118 < (int)local_158);
    iStack_304 = -(uint)(local_118._4_4_ < local_158._4_4_);
    iStack_300 = -(uint)((int)uStack_110 < (int)uStack_150);
    iStack_2fc = -(uint)(uStack_110._4_4_ < uStack_150._4_4_);
    local_f8 = CONCAT44(-(uint)(local_118._4_4_ < local_158._4_4_),
                        -(uint)((int)local_118 < (int)local_158));
    uStack_f0 = CONCAT44(-(uint)(uStack_110._4_4_ < uStack_150._4_4_),
                         -(uint)((int)uStack_110 < (int)uStack_150));
    local_e8 = local_2f8;
    uStack_e0 = uStack_2f0;
    local_2f8 = local_2f8 & local_f8;
    uStack_2f0 = uStack_2f0 & uStack_f0;
    local_c8 = local_2f8;
    uStack_c0 = uStack_2f0;
    auVar5._8_8_ = uStack_2f0;
    auVar5._0_8_ = local_2f8;
    local_30c = (uint)(ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                               (ushort)((byte)(uStack_2f0 >> 7) & 1) << 8 |
                               (ushort)((byte)(uStack_2f0 >> 0xf) & 1) << 9 |
                               (ushort)((byte)(uStack_2f0 >> 0x17) & 1) << 10 |
                               (ushort)((byte)(uStack_2f0 >> 0x1f) & 1) << 0xb |
                               (ushort)((byte)(uStack_2f0 >> 0x27) & 1) << 0xc |
                               (ushort)((byte)(uStack_2f0 >> 0x2f) & 1) << 0xd |
                               (ushort)((byte)(uStack_2f0 >> 0x37) & 1) << 0xe |
                              (ushort)(byte)(uStack_2f0 >> 0x3f) << 0xf);
    if (local_30c != 0xffff) break;
    local_294 = local_294 + -1;
  }
  for (local_28c = 0; local_28c < local_294; local_28c = local_28c + 1) {
    local_188 = (ulong *)(local_260 + (long)(local_28c << 2) * 4);
    local_88 = *local_188;
    uStack_80 = local_188[1];
    local_a8 = local_88;
    uStack_a0 = uStack_80;
    local_ac = 0x1f;
    local_a8._0_4_ = (int)local_88;
    local_a8._4_4_ = (int)(local_88 >> 0x20);
    uStack_a0._0_4_ = (int)uStack_80;
    uStack_a0._4_4_ = (int)(uStack_80 >> 0x20);
    auVar5 = ZEXT416(0x1f);
    local_338 = (int)local_a8 >> auVar5;
    iStack_334 = local_a8._4_4_ >> auVar5;
    iStack_330 = (int)uStack_a0 >> auVar5;
    iStack_32c = uStack_a0._4_4_ >> auVar5;
    local_98 = CONCAT44(iStack_334,local_338);
    uStack_90 = CONCAT44(iStack_32c,iStack_330);
    local_1d8 = local_88 ^ CONCAT44(iStack_334,local_338);
    uStack_1d0 = uStack_80 ^ CONCAT44(iStack_32c,iStack_330);
    local_1e8 = CONCAT44(iStack_334,local_338);
    uStack_1e0 = CONCAT44(iStack_32c,iStack_330);
    local_1d8._4_4_ = (int)(local_1d8 >> 0x20);
    uStack_1d0._4_4_ = (int)(uStack_1d0 >> 0x20);
    local_1d8._0_4_ = (int)local_1d8 - local_338;
    local_1d8._4_4_ = local_1d8._4_4_ - iStack_334;
    uStack_1d0._0_4_ = (int)uStack_1d0 - iStack_330;
    uStack_1d0._4_4_ = uStack_1d0._4_4_ - iStack_32c;
    local_328 = CONCAT44(local_1d8._4_4_,(int)local_1d8);
    uStack_320 = CONCAT44(uStack_1d0._4_4_,(int)uStack_1d0);
    local_138 = local_2b8[(ulong)(local_28c != 0) * 2];
    uStack_130 = local_2b8[(ulong)(local_28c != 0) * 2 + 1];
    local_128 = local_328;
    uStack_120 = uStack_320;
    local_138._4_4_ = (int)((ulong)local_138 >> 0x20);
    uStack_130._4_4_ = (int)((ulong)uStack_130 >> 0x20);
    local_348 = CONCAT44(-(uint)(local_138._4_4_ < local_1d8._4_4_),
                         -(uint)((int)local_138 < (int)local_1d8));
    uStack_340 = CONCAT44(-(uint)(uStack_130._4_4_ < uStack_1d0._4_4_),
                          -(uint)((int)uStack_130 < (int)uStack_1d0));
    local_78 = local_2b8[(ulong)(local_28c != 0) * 2];
    uStack_70 = local_2b8[(ulong)(local_28c != 0) * 2 + 1];
    local_68 = local_328;
    uStack_60 = uStack_320;
    local_78._4_4_ = (int)((ulong)local_78 >> 0x20);
    uStack_70._4_4_ = (int)((ulong)uStack_70 >> 0x20);
    local_358 = -(uint)((int)local_1d8 == (int)local_78);
    iStack_354 = -(uint)(local_1d8._4_4_ == local_78._4_4_);
    iStack_350 = -(uint)((int)uStack_1d0 == (int)uStack_70);
    iStack_34c = -(uint)(uStack_1d0._4_4_ == uStack_70._4_4_);
    local_58 = CONCAT44(-(uint)(local_1d8._4_4_ == local_78._4_4_),
                        -(uint)((int)local_1d8 == (int)local_78));
    uStack_50 = CONCAT44(-(uint)(uStack_1d0._4_4_ == uStack_70._4_4_),
                         -(uint)((int)uStack_1d0 == (int)uStack_70));
    local_48 = local_348;
    uStack_40 = uStack_340;
    local_348 = local_348 | local_58;
    uStack_340 = uStack_340 | uStack_50;
    local_d8 = local_348;
    uStack_d0 = uStack_340;
    auVar1._8_8_ = uStack_340;
    auVar1._0_8_ = local_348;
    local_35c = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                               (ushort)((byte)(uStack_340 >> 7) & 1) << 8 |
                               (ushort)((byte)(uStack_340 >> 0xf) & 1) << 9 |
                               (ushort)((byte)(uStack_340 >> 0x17) & 1) << 10 |
                               (ushort)((byte)(uStack_340 >> 0x1f) & 1) << 0xb |
                               (ushort)((byte)(uStack_340 >> 0x27) & 1) << 0xc |
                               (ushort)((byte)(uStack_340 >> 0x2f) & 1) << 0xd |
                               (ushort)((byte)(uStack_340 >> 0x37) & 1) << 0xe |
                              (ushort)(byte)(uStack_340 >> 0x3f) << 0xf);
    local_8 = &local_378;
    local_18 = local_328;
    uStack_10 = uStack_320;
    local_378 = local_328;
    uStack_370 = uStack_320;
    local_20 = &local_388;
    local_38 = CONCAT44(iStack_334,local_338);
    uStack_30 = CONCAT44(iStack_32c,iStack_330);
    local_388 = CONCAT44(iStack_334,local_338);
    uStack_380 = CONCAT44(iStack_32c,iStack_330);
    for (local_290 = 0; local_290 < 4; local_290 = local_290 + 1) {
      if ((local_35c & 1 << ((byte)(local_290 << 2) & 0x1f)) != 0) {
        iVar2 = local_28c * 4 + local_290;
        lVar4 = (long)(*(int *)((long)&local_378 + (long)local_290 * 4) +
                      (int)*(short *)(local_278 + (long)(int)(uint)(iVar2 != 0) * 2));
        uVar3 = (uint)((ulong)(((lVar4 * *(short *)(local_280 + (long)(int)(uint)(iVar2 != 0) * 2)
                                >> 0x10) + lVar4) *
                              (long)*(short *)(local_288 + (long)(int)(uint)(iVar2 != 0) * 2)) >>
                      0x10);
        *(uint *)(tmp4 + (long)iVar2 * 4) =
             (uVar3 ^ *(uint *)((long)&local_388 + (long)local_290 * 4)) -
             *(int *)((long)&local_388 + (long)local_290 * 4);
        *(int *)(tmp3 + (long)iVar2 * 4) =
             *(int *)(tmp4 + (long)iVar2 * 4) *
             (int)*(short *)(in_stack_00000018 + (long)(int)(uint)(iVar2 != 0) * 2);
        if (uVar3 != 0) {
          if (local_298 < *(short *)(abs_coeff._0_8_ + (long)iVar2 * 2)) {
            local_3a8 = (int)*(short *)(abs_coeff._0_8_ + (long)iVar2 * 2);
          }
          else {
            local_3a8 = local_298;
          }
          local_298 = local_3a8;
        }
      }
    }
  }
  *(short *)coeff_sign._0_8_ = (short)local_298 + 1;
  return;
}

Assistant:

void aom_highbd_quantize_b_sse2(const tran_low_t *coeff_ptr, intptr_t count,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  int i, j, non_zero_regs = (int)count / 4, eob_i = -1;
  __m128i zbins[2];
  __m128i nzbins[2];

  zbins[0] = _mm_set_epi32((int)zbin_ptr[1], (int)zbin_ptr[1], (int)zbin_ptr[1],
                           (int)zbin_ptr[0]);
  zbins[1] = _mm_set1_epi32((int)zbin_ptr[1]);

  nzbins[0] = _mm_setzero_si128();
  nzbins[1] = _mm_setzero_si128();
  nzbins[0] = _mm_sub_epi32(nzbins[0], zbins[0]);
  nzbins[1] = _mm_sub_epi32(nzbins[1], zbins[1]);

  (void)scan;

  memset(qcoeff_ptr, 0, count * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, count * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = ((int)count / 4) - 1; i >= 0; i--) {
    __m128i coeffs, cmp1, cmp2;
    int test;
    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    cmp1 = _mm_cmplt_epi32(coeffs, zbins[i != 0]);
    cmp2 = _mm_cmpgt_epi32(coeffs, nzbins[i != 0]);
    cmp1 = _mm_and_si128(cmp1, cmp2);
    test = _mm_movemask_epi8(cmp1);
    if (test == 0xffff)
      non_zero_regs--;
    else
      break;
  }

  // Quantization pass:
  for (i = 0; i < non_zero_regs; i++) {
    __m128i coeffs, coeffs_sign, tmp1, tmp2;
    int test;
    int abs_coeff[4];
    int coeff_sign[4];

    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    coeffs_sign = _mm_srai_epi32(coeffs, 31);
    coeffs = _mm_sub_epi32(_mm_xor_si128(coeffs, coeffs_sign), coeffs_sign);
    tmp1 = _mm_cmpgt_epi32(coeffs, zbins[i != 0]);
    tmp2 = _mm_cmpeq_epi32(coeffs, zbins[i != 0]);
    tmp1 = _mm_or_si128(tmp1, tmp2);
    test = _mm_movemask_epi8(tmp1);
    _mm_storeu_si128((__m128i *)abs_coeff, coeffs);
    _mm_storeu_si128((__m128i *)coeff_sign, coeffs_sign);

    for (j = 0; j < 4; j++) {
      if (test & (1 << (4 * j))) {
        int k = 4 * i + j;
        const int64_t tmp3 = abs_coeff[j] + round_ptr[k != 0];
        const int64_t tmp4 = ((tmp3 * quant_ptr[k != 0]) >> 16) + tmp3;
        const uint32_t abs_qcoeff =
            (uint32_t)((tmp4 * quant_shift_ptr[k != 0]) >> 16);
        qcoeff_ptr[k] =
            (int)(abs_qcoeff ^ (uint32_t)coeff_sign[j]) - coeff_sign[j];
        dqcoeff_ptr[k] = qcoeff_ptr[k] * dequant_ptr[k != 0];
        if (abs_qcoeff) eob_i = iscan[k] > eob_i ? iscan[k] : eob_i;
      }
    }
  }
  *eob_ptr = eob_i + 1;
}